

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3IncrmergeChomp(Fts3Table *p,sqlite3_int64 iAbsLevel,Fts3MultiSegReader *pCsr,int *pnRem)

{
  uint uVar1;
  char *pcVar2;
  sqlite3_mutex *psVar3;
  Vdbe *pVVar4;
  sqlite3_stmt *pStmt;
  int iVar5;
  int iVar6;
  int iVar7;
  Mem *pMVar8;
  char *aNode;
  i64 iVar9;
  void *pvVar10;
  Vdbe *p_1;
  void *pvVar11;
  void *pOld;
  void *iValue;
  Fts3SegReader *pSeg;
  sqlite3_int64 iBlock_00;
  int *pnLoad;
  uint uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  bool bVar14;
  int nBlock;
  char *aBlock;
  sqlite3_stmt *pFetch;
  sqlite3_int64 iBlock;
  Blob block;
  Blob root;
  int local_ac;
  int local_74;
  Vdbe *local_70;
  sqlite3_stmt *local_68;
  sqlite3_int64 local_60;
  Blob local_58;
  Blob local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = pCsr->nSegment;
  local_ac = 0;
  if (0 < (int)uVar1) {
    local_ac = 0;
    uVar12 = uVar1;
    do {
      if ((int)uVar1 < 1) {
        pSeg = (Fts3SegReader *)0x0;
      }
      else {
        uVar13 = 1;
        do {
          pSeg = pCsr->apSegment[uVar13 - 1];
          if (pSeg->iIdx == uVar12 - 1) break;
          bVar14 = uVar13 < uVar1;
          uVar13 = uVar13 + 1;
        } while (bVar14);
      }
      if (pSeg->aNode == (char *)0x0) {
        iVar5 = fts3DeleteSegment(p,pSeg);
        if (iVar5 == 0) {
          iVar7 = pSeg->iIdx;
          local_48.a = (char *)0x0;
          iVar5 = fts3SqlStmt(p,0x1e,(sqlite3_stmt **)&local_48,(sqlite3_value **)0x0);
          pcVar2 = local_48.a;
          if (iVar5 == 0) {
            sqlite3_bind_int64((sqlite3_stmt *)local_48.a,1,iAbsLevel);
            sqlite3_bind_int64((sqlite3_stmt *)pcVar2,2,(long)iVar7);
            sqlite3_step((sqlite3_stmt *)pcVar2);
            iVar5 = sqlite3_reset((sqlite3_stmt *)pcVar2);
          }
        }
        *pnRem = 0;
      }
      else {
        pcVar2 = pSeg->zTerm;
        uVar1 = pSeg->nTerm;
        iVar7 = pSeg->iIdx;
        local_48.a = (char *)0x0;
        local_48.n = 0;
        local_48.nAlloc = 0;
        local_58.a = (char *)0x0;
        local_58.n = 0;
        local_58.nAlloc = 0;
        local_60 = 0;
        local_68 = (sqlite3_stmt *)0x0;
        iVar5 = fts3SqlStmt(p,0x20,&local_68,(sqlite3_value **)0x0);
        pStmt = local_68;
        if (iVar5 == 0) {
          sqlite3_bind_int64(local_68,1,iAbsLevel);
          sqlite3_bind_int64(pStmt,2,(long)iVar7);
          iVar5 = sqlite3_step(pStmt);
          if (iVar5 == 100) {
            pMVar8 = columnMem(pStmt,4);
            aNode = (char *)sqlite3_value_blob(pMVar8);
            columnMallocFailure(pStmt);
            iVar5 = sqlite3_column_bytes(pStmt,4);
            pMVar8 = columnMem(pStmt,1);
            iVar9 = sqlite3VdbeIntValue(pMVar8);
            columnMallocFailure(pStmt);
            pnLoad = (int *)(ulong)uVar1;
            iVar6 = fts3TruncateNode(aNode,iVar5,&local_48,pcVar2,uVar1,&local_60);
            iVar5 = sqlite3_reset(pStmt);
            if (iVar6 != 0) {
              iVar5 = iVar6;
            }
            if (local_60 == 0 || iVar5 != 0) goto LAB_001d2ec7;
            do {
              iBlock_00 = local_60;
              local_70 = (Vdbe *)0x0;
              local_74 = 0;
              iVar5 = sqlite3Fts3ReadBlock(p,local_60,(char **)&local_70,&local_74,pnLoad);
              if (iVar5 == 0) {
                pnLoad = (int *)(ulong)uVar1;
                iVar5 = fts3TruncateNode((char *)local_70,local_74,&local_58,pcVar2,uVar1,&local_60)
                ;
                if (iVar5 == 0) {
                  iVar5 = fts3WriteSegment(p,iBlock_00,local_58.a,local_58.n);
                }
              }
              sqlite3_free(local_70);
            } while ((iVar5 == 0) && (local_60 != 0));
            if (iVar5 != 0) goto LAB_001d2f87;
            local_70 = (Vdbe *)0x0;
            iVar5 = fts3SqlStmt(p,0x11,(sqlite3_stmt **)&local_70,(sqlite3_value **)0x0);
            pVVar4 = local_70;
            if (iVar5 == 0) {
              sqlite3_bind_int64((sqlite3_stmt *)local_70,1,iVar9);
              sqlite3_bind_int64((sqlite3_stmt *)pVVar4,2,iBlock_00 + -1);
              sqlite3_step((sqlite3_stmt *)pVVar4);
              iVar5 = sqlite3_reset((sqlite3_stmt *)pVVar4);
            }
          }
          else {
            iVar5 = sqlite3_reset(pStmt);
LAB_001d2ec7:
            iBlock_00 = 0;
          }
          if (iVar5 == 0) {
            local_70 = (Vdbe *)0x0;
            iVar5 = fts3SqlStmt(p,0x21,(sqlite3_stmt **)&local_70,(sqlite3_value **)0x0);
            pVVar4 = local_70;
            if (iVar5 == 0) {
              sqlite3_bind_int64((sqlite3_stmt *)local_70,1,iBlock_00);
              bindText((sqlite3_stmt *)pVVar4,2,local_48.a,(long)local_48.n,
                       (_func_void_void_ptr *)0x0,'\0');
              sqlite3_bind_int64((sqlite3_stmt *)pVVar4,3,iAbsLevel);
              sqlite3_bind_int64((sqlite3_stmt *)pVVar4,4,(long)iVar7);
              sqlite3_step((sqlite3_stmt *)pVVar4);
              iVar5 = sqlite3_reset((sqlite3_stmt *)pVVar4);
              iVar7 = vdbeUnbind(pVVar4,1);
              if ((iVar7 == 0) && (psVar3 = pVVar4->db->mutex, psVar3 != (sqlite3_mutex *)0x0)) {
                (*sqlite3Config.mutex.xMutexLeave)(psVar3);
              }
            }
          }
        }
LAB_001d2f87:
        sqlite3_free(local_48.a);
        sqlite3_free(local_58.a);
        local_ac = local_ac + 1;
      }
      if (((int)uVar12 < 2) || (iVar5 != 0)) goto LAB_001d2fbf;
      uVar1 = pCsr->nSegment;
      uVar12 = uVar12 - 1;
    } while( true );
  }
LAB_001d2fcc:
  if (local_ac == pCsr->nSegment) {
    iVar5 = 0;
  }
  else {
    pvVar11 = (void *)0x0;
    local_48.a = (char *)0x0;
    local_58.a = (char *)0x0;
    iVar5 = fts3SqlStmt(p,0x23,(sqlite3_stmt **)&local_48,(sqlite3_value **)0x0);
    pcVar2 = local_48.a;
    pOld = pvVar11;
    if (iVar5 == 0) {
      sqlite3_bind_int64((sqlite3_stmt *)local_48.a,1,iAbsLevel);
      iVar5 = sqlite3_step((sqlite3_stmt *)pcVar2);
      if (iVar5 == 100) {
        uVar13 = 0;
        iVar5 = 0;
        pOld = (void *)0x0;
        do {
          pvVar10 = pOld;
          if ((long)iVar5 <= (long)uVar13) {
            iVar7 = sqlite3_initialize();
            if ((iVar7 != 0) ||
               (pvVar10 = sqlite3Realloc(pOld,(long)iVar5 * 4 + 0x40), pvVar10 == (void *)0x0)) {
              sqlite3_reset((sqlite3_stmt *)pcVar2);
              iVar5 = 7;
              goto LAB_001d30c4;
            }
            iVar5 = iVar5 + 0x10;
          }
          pMVar8 = columnMem((sqlite3_stmt *)pcVar2,0);
          iVar9 = sqlite3VdbeIntValue(pMVar8);
          columnMallocFailure((sqlite3_stmt *)pcVar2);
          *(int *)((long)pvVar10 + uVar13 * 4) = (int)iVar9;
          uVar13 = uVar13 + 1;
          iVar7 = sqlite3_step((sqlite3_stmt *)pcVar2);
          pOld = pvVar10;
        } while (iVar7 == 100);
        pvVar11 = (void *)(uVar13 & 0xffffffff);
      }
      else {
        pvVar10 = (void *)0x0;
      }
      iVar5 = sqlite3_reset((sqlite3_stmt *)pcVar2);
      pOld = pvVar10;
      if (iVar5 == 0) {
        iVar5 = fts3SqlStmt(p,0x1f,(sqlite3_stmt **)&local_58,(sqlite3_value **)0x0);
        pcVar2 = local_58.a;
        if (iVar5 == 0) {
          sqlite3_bind_int64((sqlite3_stmt *)local_58.a,2,iAbsLevel);
          p->bIgnoreSavepoint = '\x01';
          iVar5 = 0;
          if ((int)pvVar11 != 0) {
            iValue = (void *)0x0;
            do {
              uVar1 = *(uint *)((long)pvVar10 + (long)iValue * 4);
              iVar5 = 0;
              if (iValue != (void *)(ulong)uVar1) {
                sqlite3_bind_int64((sqlite3_stmt *)pcVar2,3,(long)(int)uVar1);
                sqlite3_bind_int64((sqlite3_stmt *)pcVar2,1,(sqlite_int64)iValue);
                sqlite3_step((sqlite3_stmt *)pcVar2);
                iVar5 = sqlite3_reset((sqlite3_stmt *)pcVar2);
              }
            } while ((iVar5 == 0) && (iValue = (void *)((long)iValue + 1), iValue < pvVar11));
          }
        }
      }
    }
LAB_001d30c4:
    p->bIgnoreSavepoint = '\0';
    sqlite3_free(pOld);
  }
LAB_001d30cf:
  *pnRem = local_ac;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
LAB_001d2fbf:
  if (iVar5 != 0) goto LAB_001d30cf;
  goto LAB_001d2fcc;
}

Assistant:

static int fts3IncrmergeChomp(
  Fts3Table *p,                   /* FTS table handle */
  sqlite3_int64 iAbsLevel,        /* Absolute level containing segments */
  Fts3MultiSegReader *pCsr,       /* Chomp all segments opened by this cursor */
  int *pnRem                      /* Number of segments not deleted */
){
  int i;
  int nRem = 0;
  int rc = SQLITE_OK;

  for(i=pCsr->nSegment-1; i>=0 && rc==SQLITE_OK; i--){
    Fts3SegReader *pSeg = 0;
    int j;

    /* Find the Fts3SegReader object with Fts3SegReader.iIdx==i. It is hiding
    ** somewhere in the pCsr->apSegment[] array.  */
    for(j=0; ALWAYS(j<pCsr->nSegment); j++){
      pSeg = pCsr->apSegment[j];
      if( pSeg->iIdx==i ) break;
    }
    assert( j<pCsr->nSegment && pSeg->iIdx==i );

    if( pSeg->aNode==0 ){
      /* Seg-reader is at EOF. Remove the entire input segment. */
      rc = fts3DeleteSegment(p, pSeg);
      if( rc==SQLITE_OK ){
        rc = fts3RemoveSegdirEntry(p, iAbsLevel, pSeg->iIdx);
      }
      *pnRem = 0;
    }else{
      /* The incremental merge did not copy all the data from this
      ** segment to the upper level. The segment is modified in place
      ** so that it contains no keys smaller than zTerm/nTerm. */
      const char *zTerm = pSeg->zTerm;
      int nTerm = pSeg->nTerm;
      rc = fts3TruncateSegment(p, iAbsLevel, pSeg->iIdx, zTerm, nTerm);
      nRem++;
    }
  }

  if( rc==SQLITE_OK && nRem!=pCsr->nSegment ){
    rc = fts3RepackSegdirLevel(p, iAbsLevel);
  }

  *pnRem = nRem;
  return rc;
}